

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubgraphNode.h
# Opt level: O3

void __thiscall
dg::SubgraphNode<dg::pta::PSNode>::addUser(SubgraphNode<dg::pta::PSNode> *this,PSNode *nd)

{
  pointer *pppPVar1;
  iterator __position;
  PSNode **ppPVar2;
  PSNode *local_8;
  
  ppPVar2 = (this->users).super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->users).super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppPVar2 == __position._M_current) {
      if (__position._M_current ==
          (this->users).super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_8 = nd;
        std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>::
        _M_realloc_insert<dg::pta::PSNode*const&>
                  ((vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>> *)&this->users,
                   __position,&local_8);
      }
      else {
        *__position._M_current = nd;
        pppPVar1 = &(this->users).
                    super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppPVar1 = *pppPVar1 + 1;
      }
      return;
    }
    if (*ppPVar2 == nd) break;
    ppPVar2 = ppPVar2 + 1;
  }
  return;
}

Assistant:

void addUser(NodeT *nd) {
        // do not add duplicate users
        for (auto *u : users)
            if (u == nd)
                return;

        users.push_back(nd);
    }